

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_19::NameGenerator::GenerateName
          (NameGenerator *this,char *prefix,Index index,uint disambiguator,string *str)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  long *plVar4;
  ulong *puVar5;
  Index IVar6;
  uint uVar7;
  string s;
  string __str;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x177708);
  std::__cxx11::string::append((char *)str);
  if (index != 0xffffffff) {
    if ((this->opts_ & AlphaNames) == None) {
      cVar3 = '\x01';
      if (9 < index) {
        IVar6 = index;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          if (IVar6 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_00155d79;
          }
          if (IVar6 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_00155d79;
          }
          if (IVar6 < 10000) goto LAB_00155d79;
          bVar1 = 99999 < IVar6;
          IVar6 = IVar6 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (bVar1);
        cVar3 = cVar3 + '\x01';
      }
LAB_00155d79:
      local_70 = &local_60;
      std::__cxx11::string::_M_construct((ulong)&local_70,cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,(uint)local_68,index);
      std::__cxx11::string::_M_append((char *)str,(ulong)local_70);
    }
    else {
      if (((*prefix == 'l') || (*prefix == 'p')) && (prefix[1] == '\0')) {
        std::__cxx11::string::_M_erase((ulong)str,str->_M_string_length - 1);
      }
      else {
        std::__cxx11::string::push_back((char)str);
      }
      local_70 = &local_60;
      local_68 = 0;
      local_60 = local_60 & 0xffffffffffffff00;
      do {
        std::__cxx11::string::push_back((char)&local_70);
        bVar1 = 0x19 < index;
        index = index / 0x1a - 1;
      } while (bVar1);
      std::__cxx11::string::_M_append((char *)str,(ulong)local_70);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
  }
  if (disambiguator != 0) {
    cVar3 = '\x01';
    if (9 < disambiguator) {
      uVar7 = disambiguator;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (uVar7 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_00155e15;
        }
        if (uVar7 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_00155e15;
        }
        if (uVar7 < 10000) goto LAB_00155e15;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_00155e15:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,disambiguator);
    plVar4 = (long *)std::__cxx11::string::insert((ulong)&local_50,0,'\x01');
    puVar5 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar5) {
      local_60 = *puVar5;
      lStack_58 = plVar4[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *puVar5;
      local_70 = (ulong *)*plVar4;
    }
    local_68 = plVar4[1];
    *plVar4 = (long)puVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)str,(ulong)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return;
}

Assistant:

void NameGenerator::GenerateName(const char* prefix,
                                 Index index,
                                 unsigned disambiguator,
                                 std::string* str) {
  *str = "$";
  *str += prefix;
  if (index != kInvalidIndex) {
    if (opts_ & NameOpts::AlphaNames) {
      // For params and locals, do not use a prefix char.
      if (!strcmp(prefix, "p") || !strcmp(prefix, "l")) {
        str->pop_back();
      } else {
        *str += '_';
      }
      *str += IndexToAlphaName(index);
    } else {
      *str += std::to_string(index);
    }
  }
  if (disambiguator != 0) {
    *str += '_' + std::to_string(disambiguator);
  }
}